

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPlotIO.cpp
# Opt level: O2

void __thiscall NaDPlotFile::WriteDPlotFile(NaDPlotFile *this)

{
  NaDynAr<NaVector> *pNVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  FILE *pFVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 *puVar12;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined8 uVar14;
  uint uVar15;
  ulong uVar16;
  long *plVar13;
  
  fprintf((FILE *)this->fp,"%s\n","DPLOT/W v1.2");
  fprintf((FILE *)this->fp,"dx\n%u\n",(ulong)(uint)(this->aVars).nItems);
  iVar8 = (this->aVars).nItems;
  if (iVar8 == 0) {
    return;
  }
  pNVar1 = &this->aVars;
  for (uVar15 = 0; (int)uVar15 < iVar8; uVar15 = uVar15 + 1) {
    iVar8 = (*(this->super_NaDataFile)._vptr_NaDataFile[7])(this);
    auVar6._4_4_ = extraout_var;
    auVar6._0_4_ = iVar8;
    auVar6._8_8_ = (long)extraout_var >> 0x1f;
    uVar9 = (*(this->super_NaDataFile)._vptr_NaDataFile[7])(this);
    iVar8 = SUB164(auVar6 / SEXT816(5),0);
    uVar7 = iVar8 * 5;
    pFVar5 = (FILE *)this->fp;
    iVar10 = (*(this->super_NaDataFile)._vptr_NaDataFile[7])(this);
    fprintf(pFVar5,"%lu\n",CONCAT44(extraout_var_00,iVar10));
    uVar16 = SUB168(auVar6 / SEXT816(5),0) & 0xffffffff;
    if (iVar8 < 1) {
      uVar16 = 0;
    }
    iVar8 = 4;
    while (iVar10 = (int)uVar16, uVar16 = (ulong)(iVar10 - 1), iVar10 != 0) {
      pFVar5 = (FILE *)this->fp;
      iVar10 = (*(this->aVars)._vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar15);
      puVar12 = (undefined8 *)
                (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar10) + 0x40))
                          ((long *)CONCAT44(extraout_var_01,iVar10),iVar8 + -4);
      uVar14 = *puVar12;
      iVar10 = (*(this->aVars)._vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar15);
      puVar12 = (undefined8 *)
                (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar10) + 0x40))
                          ((long *)CONCAT44(extraout_var_02,iVar10),iVar8 + -3);
      uVar2 = *puVar12;
      iVar10 = (*(this->aVars)._vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar15);
      puVar12 = (undefined8 *)
                (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar10) + 0x40))
                          ((long *)CONCAT44(extraout_var_03,iVar10),iVar8 + -2);
      uVar3 = *puVar12;
      iVar10 = (*(this->aVars)._vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar15);
      puVar12 = (undefined8 *)
                (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar10) + 0x40))
                          ((long *)CONCAT44(extraout_var_04,iVar10),iVar8 + -1);
      uVar4 = *puVar12;
      iVar10 = (*(this->aVars)._vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar15);
      puVar12 = (undefined8 *)
                (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar10) + 0x40))
                          ((long *)CONCAT44(extraout_var_05,iVar10),iVar8);
      fprintf(pFVar5,"%g,%g,%g,%g,%g\n",uVar14,uVar2,uVar3,uVar4,*puVar12);
      iVar8 = iVar8 + 5;
    }
    if (uVar7 != uVar9) {
      iVar10 = uVar9 + ~uVar7;
      uVar9 = uVar7;
      iVar8 = iVar10;
      if (iVar10 < 1) {
        iVar10 = 0;
        iVar8 = 0;
      }
      while( true ) {
        pFVar5 = (FILE *)this->fp;
        iVar11 = (*(this->aVars)._vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar15);
        plVar13 = (long *)CONCAT44(extraout_var_06,iVar11);
        if (iVar10 == 0) break;
        puVar12 = (undefined8 *)(**(code **)(*plVar13 + 0x40))(plVar13,uVar9);
        fprintf(pFVar5,"%g,",*puVar12);
        uVar9 = uVar9 + 1;
        iVar10 = iVar10 + -1;
      }
      puVar12 = (undefined8 *)(**(code **)(*plVar13 + 0x40))(plVar13,iVar8 + uVar7);
      fprintf(pFVar5,"%g\n",*puVar12);
    }
    pFVar5 = (FILE *)this->fp;
    iVar8 = (*(this->super_NaDataFile)._vptr_NaDataFile[7])(this);
    fprintf(pFVar5,"0,%ld\n",CONCAT44(extraout_var_07,iVar8) + -1);
    fputs(" 1    0\n",(FILE *)this->fp);
    pFVar5 = (FILE *)this->fp;
    iVar8 = (*(this->aVarNames)._vptr_NaDynAr[0xf])(&this->aVarNames,(ulong)uVar15);
    fprintf(pFVar5,"%s\n\n",*(undefined8 *)CONCAT44(extraout_var_08,iVar8));
    iVar8 = (this->aVars).nItems;
  }
  pFVar5 = (FILE *)this->fp;
  iVar8 = (*(this->super_NaDataFile)._vptr_NaDataFile[0xb])(this,0);
  fprintf(pFVar5,"%s\n",CONCAT44(extraout_var_09,iVar8));
  pFVar5 = (FILE *)this->fp;
  iVar8 = (*(this->super_NaDataFile)._vptr_NaDataFile[0xb])(this,1);
  fprintf(pFVar5,"%s\n",CONCAT44(extraout_var_10,iVar8));
  fwrite("\n\n",2,1,(FILE *)this->fp);
  fwrite("     1\n0.0,0.0\nDate\n           1\nGrid Type\n01\n",0x2e,1,(FILE *)this->fp);
  fwrite("LineWidths\n",0xb,1,(FILE *)this->fp);
  for (iVar8 = 0; iVar8 < (this->aVars).nItems; iVar8 = iVar8 + 1) {
    fwrite(" 10",3,1,(FILE *)this->fp);
  }
  fputc(10,(FILE *)this->fp);
  fwrite("PointSizes\n 7\n 10 18 14 14 14 11 10\n",0x24,1,(FILE *)this->fp);
  fwrite("SymbolSizes\n",0xc,1,(FILE *)this->fp);
  for (iVar8 = 0; iVar8 < (this->aVars).nItems; iVar8 = iVar8 + 1) {
    uVar14 = 0;
    if (iVar8 == 0) {
      uVar14 = 0x7d;
    }
    fprintf((FILE *)this->fp," %3d",uVar14);
  }
  fputc(10,(FILE *)this->fp);
  iVar8 = (*(this->super_NaDataFile)._vptr_NaDataFile[0xb])(this,2);
  if (*(char *)CONCAT44(extraout_var_11,iVar8) != '\0') {
    pFVar5 = (FILE *)this->fp;
    iVar8 = (*(this->super_NaDataFile)._vptr_NaDataFile[0xb])(this,2);
    fprintf(pFVar5,"Title3\n%s\n",CONCAT44(extraout_var_12,iVar8));
  }
  fwrite("Stop\n",5,1,(FILE *)this->fp);
  return;
}

Assistant:

void
NaDPlotFile::WriteDPlotFile ()
{
    // Magic
    fprintf(fp, "%s\n", NaIO_DPLOT_MAGIC);

    // Data format description, number of series
    fprintf(fp, "dx\n%u\n", aVars.count());

    if(0 == aVars.count()){
        return;
    }

    int iVar;
    for(iVar = 0; iVar < aVars.count(); ++iVar){
        int     nBy5, nRest, iSer;
        nBy5 = CountOfRecord() / 5;
        nRest = CountOfRecord() - 5 * nBy5;

        // Number of values in the series
        fprintf(fp, "%lu\n", CountOfRecord());
        // Values in the series
        for(iSer = 0; iSer < nBy5; ++iSer){
            fprintf(fp, "%g,%g,%g,%g,%g\n", aVars[iVar][5*iSer+0],
                    aVars[iVar][5*iSer+1], aVars[iVar][5*iSer+2],
                    aVars[iVar][5*iSer+3], aVars[iVar][5*iSer+4]);
        }
        if(nRest != 0){
            for(iSer = 0; iSer < nRest - 1; ++iSer){
                fprintf(fp, "%g,", aVars[iVar][5 * nBy5 + iSer]);
            }
            fprintf(fp, "%g\n", aVars[iVar][5 * nBy5 + iSer]);
        }
        // Argument range for the series
        fprintf(fp, "0,%ld\n", CountOfRecord() - 1);
        // Type of curve -- solid line without knots
        fputs(" 1    0\n", fp);
        // Name of the series
        fprintf(fp, "%s\n\n", aVarNames[iVar]);
    }

    // Titles
    fprintf(fp, "%s\n", GetTitle(0));
    fprintf(fp, "%s\n", GetTitle(1));

    fprintf(fp, "\n\n");

    fprintf(fp, "     1\n0.0,0.0\nDate\n           1\nGrid Type\n01\n");

    // For each series
    fprintf(fp, "LineWidths\n");
    for(iVar = 0; iVar < aVars.count(); ++iVar){
        fprintf(fp, " 10");
    }
    fprintf(fp, "\n");

    fprintf(fp, "PointSizes\n 7\n 10 18 14 14 14 11 10\n");

    fprintf(fp, "SymbolSizes\n");
    for(iVar = 0; iVar < aVars.count(); ++iVar){
        if(0 == iVar)
            fprintf(fp, " %3d", 125);
        else
            fprintf(fp, " %3d", 0);
    }
    fprintf(fp, "\n");

    if('\0' != GetTitle(2)[0])
        fprintf(fp, "Title3\n%s\n", GetTitle(2));

    // End of file
    fprintf(fp, "Stop\n");
}